

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O3

void __thiscall
TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::AddItem
          (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *this,
          TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *data)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    std::__cxx11::
    list<TPZDohrPrecondV2SubData<double,TPZDohrSubstructCondense<double>>,std::allocator<TPZDohrPrecondV2SubData<double,TPZDohrSubstructCondense<double>>>>
    ::_M_insert<TPZDohrPrecondV2SubData<double,TPZDohrSubstructCondense<double>>const&>
              ((list<TPZDohrPrecondV2SubData<double,TPZDohrSubstructCondense<double>>,std::allocator<TPZDohrPrecondV2SubData<double,TPZDohrSubstructCondense<double>>>>
                *)&this->fWork,(iterator)&this->fWork,data);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void AddItem(TPZDohrPrecondV2SubData<TVar, TSubStruct> &data)
	{
        std::lock_guard<std::mutex> lock(fAccessLock);
	  fWork.push_back(data);
	}